

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,FunctionSignature *signature,
          SymbolListCItr currSym,SymbolListCItr endSym,bool skipInitialParam)

{
  bool bVar1;
  FunctionSignaturePartsI *this_00;
  const_reference pvVar2;
  bool local_a4 [4];
  int local_a0;
  tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool> local_9c;
  tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> local_90;
  size_t local_78;
  size_t partsIndex;
  FunctionSignaturePartsI *local_60;
  FunctionSignaturePartsI *parts;
  FunctionMatch match;
  bool skipInitialParam_local;
  FunctionSignature *signature_local;
  Parser *this_local;
  SymbolListCItr endSym_local;
  SymbolListCItr currSym_local;
  
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = skipInitialParam;
  FunctionMatch::FunctionMatch((FunctionMatch *)&parts);
  local_60 = FunctionSignature::GetParts(signature);
  local_78 = 0;
  if ((match.partData.
       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    this_00 = FunctionSignature::GetParts(signature);
    pvVar2 = std::
             vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
             ::operator[](this_00,0);
    if (pvVar2->partType == Parameter) {
      local_78 = local_78 + 1;
      local_a0 = 1;
      local_a4[0] = false;
      local_a4[1] = false;
      local_a4[2] = false;
      local_a4[3] = false;
      std::make_tuple<Jinx::Impl::FunctionSignaturePartType,int,bool>
                ((FunctionSignaturePartType *)&local_9c,&local_a0,local_a4);
      std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>::
      tuple<Jinx::Impl::FunctionSignaturePartType,_int,_bool,_true,_true>(&local_90,&local_9c);
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::push_back((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   *)&match,&local_90);
    }
  }
  bVar1 = CheckFunctionCallPart(this,local_60,local_78,currSym,endSym,(FunctionMatch *)&parts);
  if (bVar1) {
    parts = (FunctionSignaturePartsI *)signature;
    FunctionMatch::FunctionMatch(__return_storage_ptr__,(FunctionMatch *)&parts);
  }
  else {
    FunctionMatch::FunctionMatch(__return_storage_ptr__);
  }
  FunctionMatch::~FunctionMatch((FunctionMatch *)&parts);
  return __return_storage_ptr__;
}

Assistant:

inline_t Parser::FunctionMatch Parser::CheckFunctionCall(const FunctionSignature & signature, SymbolListCItr currSym, SymbolListCItr endSym, bool skipInitialParam) const
	{
		FunctionMatch match;
		const auto & parts = signature.GetParts();
		size_t partsIndex = 0;
		if (skipInitialParam && signature.GetParts()[0].partType == FunctionSignaturePartType::Parameter)
		{
			partsIndex++;
			match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, 0, false));
		}
		if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, match))
		{
			match.signature = &signature;
			return match;
		}
		return FunctionMatch();
	}